

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::LoadedSourceEvent>::construct
          (BasicTypeInfo<dap::LoadedSourceEvent> *this,void *ptr)

{
  memset(ptr,0,0x150);
  LoadedSourceEvent::LoadedSourceEvent((LoadedSourceEvent *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }